

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
flatview_read_continue_mipsel
          (uc_struct_conflict5 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *ptr,hwaddr len,
          hwaddr addr1,hwaddr l,MemoryRegion *mr)

{
  hwaddr addr_00;
  MemoryRegion *mr_00;
  FlatView *uc_00;
  _Bool _Var1;
  uint size;
  MemOp_conflict2 op;
  MemTxResult MVar2;
  bool bVar3;
  void *local_58;
  uint8_t *buf;
  _Bool release_lock;
  uint64_t uStack_48;
  MemTxResult result;
  uint64_t val;
  uint8_t *ram_ptr;
  hwaddr len_local;
  void *ptr_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict5 *uc_local;
  MemTxAttrs attrs_local;
  
  buf._4_4_ = 0;
  bVar3 = false;
  local_58 = ptr;
  ram_ptr = (uint8_t *)len;
  len_local = (hwaddr)ptr;
  ptr_local = (void *)addr;
  addr_local = (hwaddr)fv;
  fv_local = (FlatView *)uc;
  uc_local._4_4_ = attrs;
  while( true ) {
    _Var1 = memory_access_is_direct(mr,false);
    if (_Var1) {
      val = (uint64_t)
            qemu_ram_ptr_length(*(uc_struct_conflict5 **)(*(long *)(addr_local + 0x20) + 0x80),
                                mr->ram_block,addr1,&l,false);
      memcpy(local_58,(void *)val,l);
    }
    else {
      _Var1 = prepare_mmio_access(mr);
      bVar3 = bVar3 || _Var1;
      size = memory_access_size(mr,(uint)l,addr1);
      uc_00 = fv_local;
      mr_00 = mr;
      addr_00 = addr1;
      l = (hwaddr)(int)size;
      op = size_memop(size);
      MVar2 = memory_region_dispatch_read_mipsel
                        ((uc_struct_conflict5 *)uc_00,mr_00,addr_00,&stack0xffffffffffffffb8,op,
                         uc_local._4_4_);
      buf._4_4_ = MVar2 | buf._4_4_;
      stn_he_p(local_58,(int)l,uStack_48);
    }
    if (bVar3) {
      bVar3 = false;
    }
    ram_ptr = ram_ptr + -l;
    local_58 = (void *)(l + (long)local_58);
    ptr_local = (void *)(l + (long)ptr_local);
    if (ram_ptr == (uint8_t *)0x0) break;
    l = (hwaddr)ram_ptr;
    mr = flatview_translate_mipsel
                   ((uc_struct_conflict5 *)fv_local,(FlatView *)addr_local,(hwaddr)ptr_local,&addr1,
                    &l,false,uc_local._4_4_);
  }
  return buf._4_4_;
}

Assistant:

MemTxResult flatview_read_continue(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                   MemTxAttrs attrs, void *ptr,
                                   hwaddr len, hwaddr addr1, hwaddr l,
                                   MemoryRegion *mr)
{
    uint8_t *ram_ptr;
    uint64_t val;
    MemTxResult result = MEMTX_OK;
    bool release_lock = false;
    uint8_t *buf = ptr;

    for (;;) {
        if (!memory_access_is_direct(mr, false)) {
            /* I/O case */
            release_lock |= prepare_mmio_access(mr);
            l = memory_access_size(mr, l, addr1);
            result |= memory_region_dispatch_read(uc, mr, addr1, &val,
                                                  size_memop(l), attrs);
            stn_he_p(buf, l, val);
        } else {
            /* RAM case */
            ram_ptr = qemu_ram_ptr_length(fv->root->uc, mr->ram_block, addr1, &l, false);
            memcpy(buf, ram_ptr, l);
        }

        if (release_lock) {
            release_lock = false;
        }

        len -= l;
        buf += l;
        addr += l;

        if (!len) {
            break;
        }

        l = len;
        mr = flatview_translate(uc, fv, addr, &addr1, &l, false, attrs);
    }

    return result;
}